

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d8.cpp
# Opt level: O1

Stream * rw::d3d8::readNativeData
                   (Stream *stream,int32 param_2,void *object,int32 param_4,int32 param_5)

{
  undefined8 *puVar1;
  ushort uVar2;
  long lVar3;
  bool bVar4;
  uint32 uVar5;
  uint uVar6;
  undefined4 *puVar7;
  undefined2 *puVar8;
  long lVar9;
  void *pvVar10;
  uint16 *puVar11;
  uint8 *puVar12;
  undefined4 *puVar13;
  long lVar14;
  int *piVar15;
  
  bVar4 = findChunk(stream,1,(uint32 *)0x0,(uint32 *)0x0);
  if (bVar4) {
    uVar5 = Stream::readU32(stream);
    if (uVar5 == 8) {
      allocLocation =
           "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/d3d/d3d8.cpp line: 116"
      ;
      puVar7 = (undefined4 *)(*DAT_00148858)(0x10,0x3000f);
      *(undefined4 **)((long)object + 0x98) = puVar7;
      *puVar7 = 8;
      uVar6 = Stream::readI32(stream);
      allocLocation =
           "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/d3d/d3d8.cpp line: 121"
      ;
      puVar8 = (undefined2 *)(*DAT_00148858)((long)(int)uVar6,0x1000f);
      (*stream->_vptr_Stream[4])(stream,puVar8,(ulong)uVar6);
      *(undefined2 *)(puVar7 + 1) = *puVar8;
      uVar2 = puVar8[1];
      *(ushort *)((long)puVar7 + 6) = uVar2;
      allocLocation =
           "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/d3d/d3d8.cpp line: 126"
      ;
      lVar9 = (*DAT_00148858)((ulong)uVar2 * 0x38,0x3000f);
      *(long *)(puVar7 + 2) = lVar9;
      uVar2 = *(ushort *)((long)puVar7 + 6);
      if (uVar2 != 0) {
        puVar13 = (undefined4 *)(puVar8 + 2);
        lVar3 = *(long *)((long)object + 0x80);
        lVar14 = 0;
        do {
          *(undefined4 *)(lVar9 + lVar14) = *puVar13;
          *(undefined4 *)(lVar9 + 4 + lVar14) = puVar13[1];
          *(undefined4 *)(lVar9 + 8 + lVar14) = puVar13[2];
          *(undefined4 *)(lVar9 + 0xc + lVar14) = puVar13[3];
          *(undefined8 *)(lVar9 + 0x10 + lVar14) =
               *(undefined8 *)(lVar3 + (ulong)(uint)puVar13[4] * 8);
          *(undefined4 *)(lVar9 + 0x18 + lVar14) = puVar13[5];
          *(undefined4 *)(lVar9 + 0x1c + lVar14) = puVar13[6];
          puVar1 = (undefined8 *)(lVar9 + 0x20 + lVar14);
          *puVar1 = 0;
          puVar1[1] = 0;
          *(undefined4 *)(lVar9 + 0x30 + lVar14) = 0;
          *(undefined1 *)(lVar9 + 0x34 + lVar14) = *(undefined1 *)(puVar13 + 10);
          *(undefined2 *)(lVar9 + 0x35 + lVar14) = 0;
          lVar14 = lVar14 + 0x38;
          puVar13 = (undefined4 *)((long)puVar13 + 0x2b);
        } while ((uint)uVar2 * 0x38 != (int)lVar14);
      }
      (*DAT_00148850)(puVar8);
      if (*(short *)((long)puVar7 + 6) == 0) {
        return stream;
      }
      piVar15 = (int *)(*(long *)(puVar7 + 2) + 4);
      uVar6 = 0;
      do {
        pvVar10 = d3d::createIndexBuffer(piVar15[2] * 2,false);
        *(void **)(piVar15 + 7) = pvVar10;
        puVar11 = d3d::lockIndices(pvVar10,0,0,0);
        (*stream->_vptr_Stream[4])(stream,puVar11,(ulong)(uint)(piVar15[2] * 2));
        d3d::unlockIndices(*(void **)(piVar15 + 7));
        *(undefined1 *)((long)piVar15 + 0x31) = 1;
        pvVar10 = d3d::createVertexBuffer(piVar15[1] * *piVar15,0,false);
        *(void **)(piVar15 + 9) = pvVar10;
        puVar12 = d3d::lockVertices(pvVar10,0,0,0);
        (*stream->_vptr_Stream[4])(stream,puVar12,(ulong)(uint)(piVar15[1] * *piVar15));
        d3d::unlockVertices(*(void **)(piVar15 + 9));
        uVar6 = uVar6 + 1;
        piVar15 = piVar15 + 0xe;
      } while (uVar6 < *(ushort *)((long)puVar7 + 6));
      return stream;
    }
    readNativeData((d3d8 *)(ulong)uVar5);
  }
  else {
    readNativeData();
  }
  return (Stream *)0x0;
}

Assistant:

Stream*
readNativeData(Stream *stream, int32, void *object, int32, int32)
{
	ASSERTLITTLE;
	Geometry *geometry = (Geometry*)object;
	uint32 platform;
	if(!findChunk(stream, ID_STRUCT, nil, nil)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		return nil;
	}
	platform = stream->readU32();
	if(platform != PLATFORM_D3D8){
		RWERROR((ERR_PLATFORM, platform));
		return nil;
	}
	InstanceDataHeader *header = rwNewT(InstanceDataHeader, 1, MEMDUR_EVENT | ID_GEOMETRY);
	geometry->instData = header;
	header->platform = PLATFORM_D3D8;

	int32 size = stream->readI32();
	uint8 *data = rwNewT(uint8, size, MEMDUR_FUNCTION | ID_GEOMETRY);
	stream->read8(data, size);
	uint8 *p = data;
	header->serialNumber = *(uint16*)p; p += 2;
	header->numMeshes = *(uint16*)p; p += 2;
	header->inst = rwNewT(InstanceData, header->numMeshes, MEMDUR_EVENT | ID_GEOMETRY);

	InstanceData *inst = header->inst;
	for(uint32 i = 0; i < header->numMeshes; i++){
		inst->minVert = *(uint32*)p; p += 4;
		inst->stride = *(uint32*)p; p += 4;
		inst->numVertices = *(uint32*)p; p += 4;
		inst->numIndices = *(uint32*)p; p += 4;
		uint32 matid = *(uint32*)p; p += 4;
		inst->material = geometry->matList.materials[matid];
		inst->vertexShader = *(uint32*)p; p += 4;
		inst->primType = *(uint32*)p; p += 4;
		inst->indexBuffer = nil; p += 4;
		inst->vertexBuffer = nil; p += 4;
		inst->baseIndex = 0; p += 4;
		inst->vertexAlpha = *p++;
		inst->managed = 0; p++;
		inst->remapped = 0; p++;	// TODO: really unused? and what's that anyway?
		inst++;
	}
	rwFree(data);

	inst = header->inst;
	for(uint32 i = 0; i < header->numMeshes; i++){
		assert(inst->indexBuffer == nil);
		inst->indexBuffer = createIndexBuffer(inst->numIndices*2, false);
		uint16 *indices = lockIndices(inst->indexBuffer, 0, 0, 0);
		stream->read8(indices, 2*inst->numIndices);
		unlockIndices(inst->indexBuffer);

		inst->managed = 1;
		assert(inst->vertexBuffer == nil);
		inst->vertexBuffer = createVertexBuffer(inst->stride*inst->numVertices, 0, false);
		uint8 *verts = lockVertices(inst->vertexBuffer, 0, 0, D3DLOCK_NOSYSLOCK);
		stream->read8(verts, inst->stride*inst->numVertices);
		unlockVertices(inst->vertexBuffer);

		inst++;
	}
	return stream;
}